

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O0

bool __thiscall
DisasmReplayer::enqueue_create_pipeline_layout
          (DisasmReplayer *this,Hash hash,VkPipelineLayoutCreateInfo *create_info,
          VkPipelineLayout *layout)

{
  PFN_vkCreatePipelineLayout p_Var1;
  VkResult VVar2;
  VkDevice pVVar3;
  VkPipelineLayout_T *pVVar4;
  VkPipelineLayout *layout_local;
  VkPipelineLayoutCreateInfo *create_info_local;
  Hash hash_local;
  DisasmReplayer *this_local;
  
  layout_local = (VkPipelineLayout *)create_info;
  create_info_local = (VkPipelineLayoutCreateInfo *)hash;
  hash_local = (Hash)this;
  if (this->device == (VulkanDevice *)0x0) {
    pVVar4 = fake_handle<VkPipelineLayout_T*>(hash);
    *layout = pVVar4;
  }
  else {
    fprintf(_stderr,"Fossilize INFO: Creating pipeline layout 0%lX\n",hash);
    fflush(_stderr);
    p_Var1 = vkCreatePipelineLayout;
    pVVar3 = Fossilize::VulkanDevice::get_device(this->device);
    VVar2 = (*p_Var1)(pVVar3,(VkPipelineLayoutCreateInfo *)layout_local,(VkAllocationCallbacks *)0x0
                      ,layout);
    if (VVar2 != VK_SUCCESS) {
      fprintf(_stderr,"Fossilize ERROR:  ... Failed!\n");
      fflush(_stderr);
      return false;
    }
    fprintf(_stderr,"Fossilize INFO:  ... Succeeded!\n");
    fflush(_stderr);
  }
  std::vector<VkPipelineLayout_T_*,_std::allocator<VkPipelineLayout_T_*>_>::push_back
            (&this->pipeline_layouts,layout);
  std::
  vector<const_VkPipelineLayoutCreateInfo_*,_std::allocator<const_VkPipelineLayoutCreateInfo_*>_>::
  push_back(&this->pipeline_layout_infos,(value_type *)&layout_local);
  return true;
}

Assistant:

bool enqueue_create_pipeline_layout(Hash hash, const VkPipelineLayoutCreateInfo *create_info, VkPipelineLayout *layout) override
	{
		if (device)
		{
			LOGI("Creating pipeline layout 0%" PRIX64 "\n", hash);
			if (vkCreatePipelineLayout(device->get_device(), create_info, nullptr, layout) != VK_SUCCESS)
			{
				LOGE(" ... Failed!\n");
				return false;
			}
			LOGI(" ... Succeeded!\n");
		}
		else
			*layout = fake_handle<VkPipelineLayout>(hash);

		pipeline_layouts.push_back(*layout);
		pipeline_layout_infos.push_back(create_info);
		return true;
	}